

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcGenTarg::CTcGenTarg(CTcGenTarg *this)

{
  char *pcVar1;
  CVmHashTable *hash_function;
  undefined8 *puVar2;
  CTcGenTarg *in_RDI;
  int i;
  CTcT3ExcTable *in_stack_ffffffffffffffd0;
  CTcT3ExcTable *nm;
  int hash_table_size;
  int local_18;
  
  nm = &in_RDI->exc_table_;
  CTcT3ExcTable::CTcT3ExcTable(in_stack_ffffffffffffffd0);
  CTcStreamLayout::CTcStreamLayout(&in_RDI->const_layout_);
  CTcStreamLayout::CTcStreamLayout(&in_RDI->code_layout_);
  in_RDI->last_op_ = 0xf2;
  in_RDI->second_last_op_ = 0xf2;
  in_RDI->max_str_len_ = 0;
  in_RDI->max_list_cnt_ = 0;
  in_RDI->max_bytecode_len_ = 0;
  in_RDI->meta_tail_ = (tc_meta_entry *)0x0;
  in_RDI->meta_head_ = (tc_meta_entry *)0x0;
  in_RDI->meta_cnt_ = 0;
  in_RDI->fnset_tail_ = (tc_fnset_entry *)0x0;
  in_RDI->fnset_head_ = (tc_fnset_entry *)0x0;
  in_RDI->fnset_cnt_ = 0;
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  add_meta(in_RDI,(char *)nm);
  hash_table_size = (int)((ulong)nm >> 0x20);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    in_RDI->predef_meta_idx_[local_18] = local_18;
  }
  in_RDI->next_prop_ = 1;
  in_RDI->next_obj_ = 1;
  in_RDI->sort_buf_size_ = 0x1000;
  pcVar1 = (char *)malloc(in_RDI->sort_buf_size_);
  in_RDI->sort_buf_ = pcVar1;
  in_RDI->field_0xd0 = in_RDI->field_0xd0 & 0xfe;
  in_RDI->field_0xd0 = in_RDI->field_0xd0 & 0xfd;
  in_RDI->debug_line_cnt_ = 0;
  in_RDI->debug_line_tail_ = (tct3_debug_line_page *)0x0;
  in_RDI->debug_line_head_ = (tct3_debug_line_page *)0x0;
  in_RDI->field_0xd0 = in_RDI->field_0xd0 & 0xfb;
  in_RDI->field_0xd0 = in_RDI->field_0xd0 & 0xf7;
  in_RDI->field_0xd0 = in_RDI->field_0xd0 & 0xef;
  in_RDI->debug_stack_level_ = 0;
  in_RDI->mminit_obj_ = 0;
  hash_function = (CVmHashTable *)operator_new(0x20);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = 0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)hash_function);
  CVmHashTable::CVmHashTable
            ((CVmHashTable *)in_RDI,hash_table_size,(CVmHashFunc *)hash_function,
             (int)((ulong)puVar2 >> 0x20));
  in_RDI->strtab_ = hash_function;
  return;
}

Assistant:

CTcGenTarg::CTcGenTarg()
{
    int i;
    
    /* 
     *   we haven't written any instructions yet - fill the pipe with
     *   no-op instructions so that we don't think we can combine the
     *   first instruction with anything previous 
     */
    last_op_ = OPC_NOP;
    second_last_op_ = OPC_NOP;

    /* 
     *   we haven't seen any strings or lists yet - set the initial
     *   maximum lengths to zero 
     */
    max_str_len_ = 0;
    max_list_cnt_ = 0;

    /* we haven't generated any code yet */
    max_bytecode_len_ = 0;

    /* there are no metaclasses defined yet */
    meta_head_ = meta_tail_ = 0;
    meta_cnt_ = 0;

    /* no function sets defined yet */
    fnset_head_ = fnset_tail_ = 0;
    fnset_cnt_ = 0;

    /* 
     *   Add the built-in metaclass entries.  The order of these entries
     *   is fixed to match the TCT3_METAID_xxx constants - if this order
     *   changes, those constants must change to match.  
     */
    add_meta("tads-object");
    add_meta("list");
    add_meta("dictionary2/030000");
    add_meta("grammar-production/030000");
    add_meta("vector");
    add_meta("anon-func-ptr");
    add_meta("int-class-mod/030000");
    add_meta("lookuptable/030003");

    /*
     *   Set up the initial translation table for translating from our
     *   internal metaclass index values - TCT3_METAID_xxx - to the *actual*
     *   image file dependency index.  When we're compiling a program, these
     *   are simply in our own internal order - index N in our scheme is
     *   simply index N in the actual image file - because we get to lay out
     *   exactly what the dependency table looks like.  However, we need the
     *   translation table for when we're being used as part of the debugger
     *   - in those cases, we don't get to dictate the dependency table
     *   layout, because the image file (and thus the dependency table) might
     *   have been generated by a different version of the compiler.  In
     *   those cases, the image file loader will have to set up the
     *   translation information for us.  
     */
    for (i = 0 ; i <= TCT3_METAID_LAST ; ++i)
        predef_meta_idx_[i] = i;
    
    /* start at the first valid property ID */
    next_prop_ = 1;

    /* start at the first valid object ID */
    next_obj_ = 1;

    /* allocate an initial sort buffer */
    sort_buf_size_ = 4096;
    sort_buf_ = (char *)t3malloc(sort_buf_size_);

    /* not in a constructor */
    in_constructor_ = FALSE;

    /* not in an operator overload */
    in_op_overload_ = FALSE;

    /* no debug line record pointers yet */
    debug_line_cnt_ = 0;
    debug_line_head_ = debug_line_tail_ = 0;

    /* normal (static compiler, non-debug) evaluation mode */
    eval_for_dyn_ = FALSE;
    eval_for_debug_ = FALSE;
    speculative_ = FALSE;
    debug_stack_level_ = 0;

    /* no multi-method initializer object yet */
    mminit_obj_ = VM_INVALID_OBJ;

    /* create the string interning hash table */
    strtab_ = new CVmHashTable(1024, new CVmHashFuncCS(), TRUE);
}